

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_pipeline_layouts
          (Impl *this,StateCreatorInterface *iface,Value *layouts)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  size_t size;
  ulonglong uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ConstMemberIterator CVar6;
  Ch *pCVar7;
  const_iterator cVar8;
  Type pGVar9;
  Number NVar10;
  mapped_type *ppVVar11;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_01;
  Pointer this_02;
  Hash hash;
  ulonglong local_58;
  Data local_50;
  StateCreatorInterface *local_40;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_38;
  
  local_40 = iface;
  if ((layouts->data_).f.flags != 3) {
    __assert_fail("IsObject()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x49a,
                  "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::MemberCount() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  uVar5 = (ulong)(layouts->data_).s.length;
  if (uVar5 == 0) {
    local_50.s.str = (Ch *)0x0;
  }
  else {
    size = uVar5 * 0x30;
    local_50.s.str = (Ch *)ScratchAllocator::allocate_raw(&this->allocator,size,0x10);
    if (local_50.s.str != (Ch *)0x0) {
      memset(local_50.s.str,0,size);
    }
    if ((layouts->data_).f.flags != 3) {
      __assert_fail("IsObject()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                    ,0x4d8,
                    "ConstMemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberBegin() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
  }
  this_02 = (Pointer)((ulong)(layouts->data_).s.str & 0xffffffffffff);
  CVar6 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::MemberEnd(layouts);
  if (CVar6.ptr_ != this_02) {
    this_01 = &(this->replayed_pipeline_layouts)._M_h;
    uVar5 = 0;
    local_38 = this_01;
    do {
      pCVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(&this_02->name);
      local_58 = strtoull(pCVar7,(char **)0x0,0x10);
      cVar8 = std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(this_01,&local_58);
      uVar2 = local_50.s.str;
      if (cVar8.
          super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_false>.
          _M_cur == (__node_type *)0x0) {
        this_00 = &this_02->value;
        pCVar7 = local_50.s.str + uVar5 * 0x30;
        pCVar7[0] = '\x1e';
        pCVar7[1] = '\0';
        pCVar7[2] = '\0';
        pCVar7[3] = '\0';
        pGVar9 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)this_00,"flags");
        if ((undefined1  [16])((undefined1  [16])pGVar9->data_ & (undefined1  [16])0x40000000000000)
            == (undefined1  [16])0x0) {
          __assert_fail("data_.f.flags & kUintFlag",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                        ,0x719,
                        "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                       );
        }
        pCVar7 = (Ch *)(uVar2 + uVar5 * 0x30);
        *(SizeType *)(pCVar7 + 0x10) = (pGVar9->data_).s.length;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_50.s,(Ch *)this_00);
        uVar2 = local_50.n;
        NVar10.i = (I)rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::MemberEnd(this_00);
        if (uVar2 != NVar10.i64) {
          pGVar9 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this_00,"pushConstantRanges");
          if ((pGVar9->data_).f.flags != 4) goto LAB_0014506a;
          *(SizeType *)(pCVar7 + 0x20) = (pGVar9->data_).s.length;
          pGVar9 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this_00,"pushConstantRanges");
          parse_push_constant_ranges(this,pGVar9,(VkPushConstantRange **)(pCVar7 + 0x28));
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_50.s,(Ch *)this_00);
        uVar2 = local_50.n;
        NVar10.i = (I)rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::MemberEnd(this_00);
        if (uVar2 != NVar10.i64) {
          pGVar9 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this_00,"setLayouts");
          if ((pGVar9->data_).f.flags != 4) {
LAB_0014506a:
            __assert_fail("IsArray()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                          ,0x66a,
                          "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                         );
          }
          *(SizeType *)(pCVar7 + 0x14) = (pGVar9->data_).s.length;
          pGVar9 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)this_00,"setLayouts");
          bVar3 = parse_set_layouts(this,pGVar9,(VkDescriptorSetLayout **)(pCVar7 + 0x18));
          if (!bVar3) {
            return false;
          }
        }
        this_01 = local_38;
        uVar1 = local_58;
        ppVVar11 = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)local_38,&local_58);
        iVar4 = (*local_40->_vptr_StateCreatorInterface[7])(local_40,uVar1,pCVar7,ppVVar11);
        if ((char)iVar4 == '\0') {
          return false;
        }
      }
      this_02 = this_02 + 1;
      uVar5 = (ulong)((int)uVar5 + 1);
      CVar6 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::MemberEnd(layouts);
    } while (this_02 != CVar6.ptr_);
  }
  (*local_40->_vptr_StateCreatorInterface[0x11])();
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_pipeline_layouts(StateCreatorInterface &iface, const Value &layouts)
{
	auto *infos = allocator.allocate_n_cleared<VkPipelineLayoutCreateInfo>(layouts.MemberCount());

	unsigned index = 0;
	for (auto itr = layouts.MemberBegin(); itr != layouts.MemberEnd(); ++itr, index++)
	{
		Hash hash = string_to_uint64(itr->name.GetString());
		if (replayed_pipeline_layouts.count(hash))
			continue;
		auto &obj = itr->value;
		auto &info = infos[index];
		info.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;

		info.flags = obj["flags"].GetUint();

		if (obj.HasMember("pushConstantRanges"))
		{
			info.pushConstantRangeCount = obj["pushConstantRanges"].Size();
			if (!parse_push_constant_ranges(obj["pushConstantRanges"], &info.pPushConstantRanges))
				return false;
		}

		if (obj.HasMember("setLayouts"))
		{
			info.setLayoutCount = obj["setLayouts"].Size();
			if (!parse_set_layouts(obj["setLayouts"], &info.pSetLayouts))
				return false;
		}

		if (!iface.enqueue_create_pipeline_layout(hash, &info, &replayed_pipeline_layouts[hash]))
			return false;
	}

	iface.notify_replayed_resources_for_type();
	return true;
}